

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

string * fs_trim_abi_cxx11_(string *__return_storage_ptr__,string_view s)

{
  long lVar1;
  size_type i;
  allocator<char> local_22;
  undefined1 local_21;
  undefined1 local_20 [8];
  string_view s_local;
  string *r;
  
  s_local._M_len = (size_t)s._M_str;
  local_20 = (undefined1  [8])s._M_len;
  local_21 = 0;
  s_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_22);
  std::allocator<char>::~allocator(&local_22);
  lVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0);
  if (lVar1 != -1) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_trim(std::string_view s)
{
  // trim trailing nulls
  std::string r(s);
  if(auto i = r.find('\0'); i != std::string::npos)
    r.resize(i);

  return r;
}